

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

factor * __thiscall
merlin::factor::condition
          (factor *__return_storage_ptr__,factor *this,vector<int,_std::allocator<int>_> *evidence)

{
  pointer puVar1;
  long lVar2;
  variable_set v_rem;
  variable_set vs;
  variable_set local_108;
  factor local_c8;
  variable_set local_68;
  
  local_108.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_d = (vsize *)0x0;
  puVar1 = (this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    lVar2 = 0;
    do {
      if (-1 < (evidence->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(int)puVar1[lVar2]]) {
        local_c8._vptr_factor = (_func_int **)puVar1[lVar2];
        local_c8.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(this->v_).m_d[lVar2];
        variable_set::operator|=(&local_108,(variable *)&local_c8);
      }
      lVar2 = lVar2 + 1;
      puVar1 = (this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 != (long)(this->v_).m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
  }
  factor(__return_storage_ptr__,this);
  if (local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar2 = 0;
    do {
      local_c8._vptr_factor =
           (_func_int **)
           local_108.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      local_c8.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_108.m_d[lVar2];
      variable_set::variable_set(&local_68,(variable *)&local_c8);
      condition(&local_c8,__return_storage_ptr__,&local_68,
                (long)(evidence->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start
                      [local_108.m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar2]]);
      operator=(__return_storage_ptr__,&local_c8);
      ~factor(&local_c8);
      variable_set::~variable_set(&local_68);
      lVar2 = lVar2 + 1;
    } while (lVar2 != (long)local_108.m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  variable_set::~variable_set(&local_108);
  return __return_storage_ptr__;
}

Assistant:

factor condition(std::vector<int>& evidence) const {
		variable_set v_rem;
		for (variable_set::const_iterator i = vars().begin();
				i != vars().end(); ++i) {
			int v = i->label();
			if (evidence[v] >= 0) {
				v_rem |= (*i);
			}
		}

		factor F = *this;
		for (variable_set::const_iterator i = v_rem.begin();
				i != v_rem.end(); ++i) {
			variable_set vs(*i);
			int val = evidence[i->label()];
			F = F.condition(vs, val);
		}

		return F;
	}